

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::createInstance
          (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *this,
          Context *context)

{
  ostringstream *this_00;
  PrimitiveWideness PVar1;
  BaseRenderingTestInstance *this_01;
  VkPhysicalDeviceFeatures *pVVar2;
  VkPhysicalDeviceProperties *pVVar3;
  float *pfVar4;
  NotSupportedError *pNVar5;
  iterator iVar6;
  deUint32 *this_02;
  float *__args;
  float fVar7;
  undefined1 local_1a8 [384];
  
  this_01 = (BaseRenderingTestInstance *)operator_new(0x2b0);
  PVar1 = this->m_wideness;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_01,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  (this_01->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__PointTestInstance_00d01418;
  this_01[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x300000000;
  *(PrimitiveWideness *)&this_01[1].super_TestInstance.m_context = PVar1;
  *(undefined1 *)((long)&this_01[1].super_TestInstance.m_context + 4) = 1;
  this_01[1].m_renderSize = 0x3f800000;
  this_02 = &this_01[1].m_subpixelBits;
  this_01[1].m_subpixelBits = 0;
  this_01[1].m_multisampling = 0;
  this_01[1].m_imageFormat = VK_FORMAT_UNDEFINED;
  this_01[1].m_textureFormat.order = R;
  *(undefined8 *)&this_01[1].m_textureFormat.type = 0;
  if (PVar1 == PRIMITIVEWIDENESS_WIDE) {
    pVVar2 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
    if (pVVar2->largePoints == 0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"large point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4cb);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pVVar3 = Context::getDeviceProperties(context);
    local_1a8._0_8_ = ((this_01->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"GL_ALIASED_POINT_SIZE_RANGE = [",0x1f);
    std::ostream::_M_insert<double>((double)(pVVar3->limits).pointSizeRange[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)(pVVar3->limits).pointSizeRange[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    __args = (pVVar3->limits).pointSizeRange + 1;
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    if (*__args <= 1.0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"wide point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4d3);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a8._0_4_ = 10.0;
    iVar6._M_current = *(float **)&this_01[1].m_imageFormat;
    pfVar4 = *(float **)&this_01[1].m_textureFormat.type;
    if (iVar6._M_current == pfVar4) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)this_02,iVar6,(float *)local_1a8);
      iVar6._M_current = *(float **)&this_01[1].m_imageFormat;
      pfVar4 = *(float **)&this_01[1].m_textureFormat.type;
    }
    else {
      *iVar6._M_current = 10.0;
      iVar6._M_current = iVar6._M_current + 1;
      *(float **)&this_01[1].m_imageFormat = iVar6._M_current;
    }
    local_1a8._0_4_ = 0x41c80000;
    if (iVar6._M_current == pfVar4) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)this_02,iVar6,(float *)local_1a8);
      iVar6._M_current = *(float **)&this_01[1].m_imageFormat;
      pfVar4 = *(float **)&this_01[1].m_textureFormat.type;
    }
    else {
      *iVar6._M_current = 25.0;
      iVar6._M_current = iVar6._M_current + 1;
      *(float **)&this_01[1].m_imageFormat = iVar6._M_current;
    }
    if (iVar6._M_current == pfVar4) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)this_02,iVar6,__args);
      fVar7 = *__args;
    }
    else {
      fVar7 = *__args;
      *iVar6._M_current = fVar7;
      *(float **)&this_01[1].m_imageFormat = iVar6._M_current + 1;
    }
    this_01[1].m_renderSize = (deUint32)fVar7;
  }
  else if (PVar1 == PRIMITIVEWIDENESS_NARROW) {
    local_1a8._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_02,3,(value_type_conflict2 *)local_1a8)
    ;
  }
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance		(Context& context) const
								{
									return new ConcreteTestInstance(context, m_wideness, m_sampleCount);
								}